

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall Js::ScriptContext::ShutdownClearSourceLists(ScriptContext *this)

{
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar1;
  Recycler *pRVar2;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
  *pLVar3;
  ScriptContext *this_local;
  
  pLVar1 = Memory::RecyclerRootPtr::operator_cast_to_List_((RecyclerRootPtr *)&this->sourceList);
  if (pLVar1 != (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                 *)0x0) {
    if (((this->super_ScriptContextBase).isClosed & 1U) != 0) {
      MapFunction<Js::ScriptContext::ShutdownClearSourceLists()::__0>
                (this,(anon_class_8_1_8991fb9c_for_mapper)this);
    }
    EnsureClearDebugDocument(this);
    pRVar2 = GetRecycler(this);
    Memory::
    RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
    ::Unroot(&this->sourceList,pRVar2);
  }
  pLVar3 = Memory::RecyclerRootPtr::operator_cast_to_List_
                     ((RecyclerRootPtr *)&this->calleeUtf8SourceInfoList);
  if (pLVar3 != (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
                 *)0x0) {
    pRVar2 = GetRecycler(this);
    Memory::
    RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
    ::Unroot(&this->calleeUtf8SourceInfoList,pRVar2);
  }
  return;
}

Assistant:

void ScriptContext::ShutdownClearSourceLists()
    {
        if (this->sourceList)
        {
            // In the unclean shutdown case, we might not have destroyed the script context when
            // this is called- in which case, skip doing this work and simply release the source list
            // so that it doesn't show up as a leak. Since we're doing unclean shutdown, it's ok to
            // skip cleanup here for expediency.
            if (this->isClosed)
            {
                this->MapFunction([this](Js::FunctionBody* functionBody) {
                    Assert(functionBody->GetScriptContext() == this);
                    functionBody->CleanupSourceInfo(true);
                });
            }

#ifdef ENABLE_SCRIPT_DEBUGGING
            EnsureClearDebugDocument();
#endif

            // Don't need the source list any more so ok to release
            this->sourceList.Unroot(this->GetRecycler());
        }

        if (this->calleeUtf8SourceInfoList)
        {
            this->calleeUtf8SourceInfoList.Unroot(this->GetRecycler());
        }
    }